

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lab5.cpp
# Opt level: O2

void parse(ifstream *in,people *man)

{
  char cVar1;
  state sVar2;
  int iVar3;
  istream *piVar4;
  string *arr;
  int i;
  int iVar5;
  string str;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  str._M_dataplus._M_p = (pointer)&str.field_2;
  str._M_string_length = 0;
  str.field_2._M_local_buf[0] = '\0';
  for (iVar5 = 0; iVar5 != 0xc; iVar5 = iVar5 + 1) {
    piVar4 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)in,(string *)&str,',');
    if (((byte)piVar4[*(long *)(*(long *)piVar4 + -0x18) + 0x20] & 5) == 0) {
      switch(iVar5) {
      case 0:
        if (str._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_50,(string *)&str);
          arr = &local_50;
          iVar3 = to_int(arr);
          man->id = iVar3;
LAB_0010142e:
          std::__cxx11::string::~string((string *)arr);
        }
        break;
      case 1:
        if (str._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_70,(string *)&str);
          arr = &local_70;
          iVar3 = to_int(arr);
          man->surv = iVar3 + 1;
          goto LAB_0010142e;
        }
        break;
      case 2:
        if (str._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_90,(string *)&str);
          iVar3 = to_int(&local_90);
          std::__cxx11::string::~string((string *)&local_90);
          if (iVar3 == 3) {
            man->people_pclass = THIRD;
          }
          else if (iVar3 == 2) {
            man->people_pclass = SECOND;
          }
          else if (iVar3 == 1) {
            man->people_pclass = FIRST;
          }
        }
        break;
      case 5:
        if (str._M_string_length != 0) {
          if (*str._M_dataplus._M_p == 'f') {
            man->people_sex = FEMALE;
          }
          else if (*str._M_dataplus._M_p == 'm') {
            man->people_sex = MALE;
          }
        }
        break;
      case 6:
        if (str._M_string_length != 0) {
          std::__cxx11::string::string((string *)&local_b0,(string *)&str);
          arr = &local_b0;
          iVar3 = to_int(arr);
          man->age = iVar3;
          goto LAB_0010142e;
        }
      }
    }
  }
  std::getline<char,std::char_traits<char>,std::allocator<char>>((istream *)in,(string *)&str,'\r');
  if (str._M_string_length != 0) {
    cVar1 = *str._M_dataplus._M_p;
    if (cVar1 == 'C') {
      sVar2 = CHERBOURG;
    }
    else if (cVar1 == 'Q') {
      sVar2 = QUEENSTOWN;
    }
    else {
      if (cVar1 != 'S') goto LAB_001014ad;
      sVar2 = SOUTHAMPTON;
    }
    man->people_state = sVar2;
  }
LAB_001014ad:
  std::__cxx11::string::~string((string *)&str);
  return;
}

Assistant:

void parse(std::ifstream* in, people* man){
    std::string str;
    for (int i = 0; i < 12; i ++){
        if (getline(*in, str, ','))
        switch (i) {
            case 0:
                if (str.length())
                man->id = to_int(str);
                break;
            case 1:
                if (str.length())
                man->surv = to_int(str) + 1;
                break;
            case 2:
                if (str.length())
                switch (to_int(str)){
                    case 1:
                        man->people_pclass = FIRST;
                        break;
                    case 2:
                        man->people_pclass = SECOND;
                        break;
                    case 3:
                        man->people_pclass = THIRD;
                        break;
                }
                break;
            case 5:
                if (str.length())
                switch (str[0]) {
                    case 'm':
                        man->people_sex = MALE;
                        break;
                    case 'f':
                        man->people_sex = FEMALE;
                        break;
                }
                break;
            case 6:
                if (str.length())
                man->age = to_int(str);
                break;
        }

    }
    getline(*in, str, '\r');
    if (str.length())
    switch (str[0]){
        case 'S':
            man->people_state = SOUTHAMPTON;
            break;
        case 'Q':
            man->people_state = QUEENSTOWN;
            break;
        case 'C':
            man->people_state = CHERBOURG;
            break;
    }
}